

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_> * __thiscall
tinyusdz::GPrim::get_primvars
          (vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>
           *__return_storage_ptr__,GPrim *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr p_Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  long lVar8;
  _Base_ptr p_Var9;
  void *__s2;
  long *local_390;
  _Base_ptr local_388;
  long local_380 [2];
  string local_370;
  GeomPrimvar local_350;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var9 = (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->props)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var2) {
    paVar3 = &local_350._name.field_2;
    do {
      p_Var1 = p_Var9 + 1;
      local_350._name._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"primvars:","");
      _Var5._M_p = local_350._name._M_dataplus._M_p;
      if (p_Var9[1]._M_parent < local_350._name._M_string_length) {
        bVar6 = false;
      }
      else if ((_Base_ptr)local_350._name._M_string_length == (_Base_ptr)0x0) {
        bVar6 = true;
      }
      else {
        iVar7 = bcmp(local_350._name._M_dataplus._M_p,*(void **)p_Var1,
                     local_350._name._M_string_length);
        bVar6 = iVar7 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != paVar3) {
        operator_delete(_Var5._M_p,
                        CONCAT71(local_350._name.field_2._M_allocated_capacity._1_7_,
                                 local_350._name.field_2._M_local_buf[0]) + 1);
      }
      if (bVar6) {
        local_350._name._M_dataplus._M_p = (pointer)paVar3;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,":indices","");
        if (p_Var9[1]._M_parent < local_350._name._M_string_length) {
          bVar6 = false;
        }
        else {
          lVar8 = ::std::__cxx11::string::find
                            ((char *)p_Var1,(ulong)local_350._name._M_dataplus._M_p,
                             (long)p_Var9[1]._M_parent - local_350._name._M_string_length);
          bVar6 = lVar8 != -1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._name._M_dataplus._M_p != paVar3) {
          operator_delete(local_350._name._M_dataplus._M_p,
                          CONCAT71(local_350._name.field_2._M_allocated_capacity._1_7_,
                                   local_350._name.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar6) {
          local_350._name._M_string_length = 0;
          local_350._name.field_2._M_local_buf[0] = '\0';
          local_350._has_value = false;
          local_350._attr._name._M_dataplus._M_p = (pointer)&local_350._attr._name.field_2;
          local_350._attr._name._M_string_length = 0;
          local_350._attr._name.field_2._M_local_buf[0] = '\0';
          local_350._attr._variability = Varying;
          local_350._attr._varying_authored = false;
          local_350._attr._type_name._M_dataplus._M_p = (pointer)&local_350._attr._type_name.field_2
          ;
          local_350._attr._type_name._M_string_length = 0;
          local_350._attr._type_name.field_2._M_local_buf[0] = '\0';
          local_350._attr._var._value.v_.vtable =
               (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_350._attr._var._value.v_.storage.dynamic = (void *)0x0;
          local_350._attr._var._blocked = false;
          local_350._attr._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_350._attr._var._ts._17_8_ = 0;
          local_350._attr._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_350._attr._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_350._attr._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_350._attr._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          local_350._attr._metas.elementSize.has_value_ = false;
          local_350._attr._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
          local_350._attr._metas.hidden.has_value_ = false;
          local_350._attr._metas.hidden.contained = (storage_t<bool>)0x0;
          local_350._attr._metas.comment.has_value_ = false;
          local_350._attr._metas.weight.contained = (storage_t<double>)0x0;
          local_350._attr._metas.connectability.has_value_ = false;
          local_350._attr._metas.bindMaterialAs.contained._16_8_ = 0;
          local_350._attr._metas.bindMaterialAs.contained._24_8_ = 0;
          local_350._attr._metas.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.bindMaterialAs.contained._8_8_ = 0;
          local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_350._attr._metas.customData.has_value_ = false;
          local_350._attr._metas.comment.contained._32_8_ = 0;
          local_350._attr._metas.comment.contained._40_8_ = 0;
          local_350._attr._metas.comment.contained._16_8_ = 0;
          local_350._attr._metas.comment.contained._24_8_ = 0;
          local_350._attr._metas.comment.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.comment.contained._8_8_ = 0;
          local_350._attr._metas.weight.has_value_ = false;
          local_350._attr._metas.customData.contained._32_8_ = 0;
          local_350._attr._metas.customData.contained._40_8_ = 0;
          local_350._attr._metas.customData.contained._16_8_ = 0;
          local_350._attr._metas.customData.contained._24_8_ = 0;
          local_350._attr._metas.customData.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.customData.contained._8_8_ = 0;
          local_350._attr._metas.outputName.has_value_ = false;
          local_350._attr._metas.connectability.contained._16_8_ = 0;
          local_350._attr._metas.connectability.contained._24_8_ = 0;
          local_350._attr._metas.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.connectability.contained._8_8_ = 0;
          local_350._attr._metas.renderType.has_value_ = false;
          local_350._attr._metas.outputName.contained._16_8_ = 0;
          local_350._attr._metas.outputName.contained._24_8_ = 0;
          local_350._attr._metas.outputName.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.outputName.contained._8_8_ = 0;
          local_350._attr._metas.sdrMetadata.has_value_ = false;
          local_350._attr._metas.renderType.contained._16_8_ = 0;
          local_350._attr._metas.renderType.contained._24_8_ = 0;
          local_350._attr._metas.renderType.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.renderType.contained._8_8_ = 0;
          local_350._attr._metas.displayName.has_value_ = false;
          local_350._attr._metas.sdrMetadata.contained._32_8_ = 0;
          local_350._attr._metas.sdrMetadata.contained._40_8_ = 0;
          local_350._attr._metas.sdrMetadata.contained._16_8_ = 0;
          local_350._attr._metas.sdrMetadata.contained._24_8_ = 0;
          local_350._attr._metas.sdrMetadata.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.sdrMetadata.contained._8_8_ = 0;
          local_350._attr._metas.displayGroup.has_value_ = false;
          local_350._attr._metas.displayName.contained._16_8_ = 0;
          local_350._attr._metas.displayName.contained._24_8_ = 0;
          local_350._attr._metas.displayName.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.displayName.contained._8_8_ = 0;
          local_350._attr._metas.bindMaterialAs.has_value_ = false;
          local_350._attr._metas.displayGroup.contained._16_8_ = 0;
          local_350._attr._metas.displayGroup.contained._24_8_ = 0;
          local_350._attr._metas.displayGroup.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          local_350._attr._metas.displayGroup.contained._8_8_ = 0;
          local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_350._attr._153_8_ = 0;
          local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_350._attr._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_350._attr._metas.meta._M_t._M_impl + 8);
          local_350._unauthoredValuesIndex.has_value_ = false;
          local_350._unauthoredValuesIndex.contained = (storage_t<int>)0x0;
          local_350._elementSize.has_value_ = false;
          local_350._elementSize.contained = (storage_t<unsigned_int>)0x0;
          local_350._interpolation.has_value_ = false;
          local_350._interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          local_350._ts_indices._dirty = false;
          local_350._ts_indices._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_350._ts_indices._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_350._ts_indices._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_350._indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_350._attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_350._attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_350._attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_390 = local_380;
          local_350._name._M_dataplus._M_p = (pointer)paVar3;
          local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_350._attr._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"primvars:","");
          p_Var4 = p_Var9[1]._M_parent;
          if (p_Var4 < local_388) {
            __s2 = *(void **)p_Var1;
LAB_0046d8bc:
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,__s2,(long)&p_Var4->_M_color + (long)__s2);
          }
          else {
            if (local_388 != (_Base_ptr)0x0) {
              __s2 = *(void **)p_Var1;
              iVar7 = bcmp(local_390,__s2,(size_t)local_388);
              if (iVar7 != 0) goto LAB_0046d8bc;
            }
            ::std::__cxx11::string::substr((ulong)&local_370,(ulong)p_Var1);
          }
          bVar6 = get_primvar(this,&local_370,&local_350,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if (local_390 != local_380) {
            operator_delete(local_390,local_380[0] + 1);
          }
          if (bVar6) {
            ::std::vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>::
            emplace_back<tinyusdz::GeomPrimvar>(__return_storage_ptr__,&local_350);
          }
          GeomPrimvar::~GeomPrimvar(&local_350);
        }
      }
      p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

bool IsSupportedGeomPrimvarType(uint32_t tyid) {
  //
  // scalar and 1D
  //
#define SUPPORTED_TYPE_FUN(__ty)                                           \
  case value::TypeTraits<__ty>::type_id(): {                                 \
    return true;                                                           \
  }                                                                        \
  case (value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT): { \
    return true;                                                           \
  }

  switch (tyid) {
    APPLY_GEOMPRIVAR_TYPE(SUPPORTED_TYPE_FUN)
    default:
      return false;
  }

#undef SUPPORTED_TYPE_FUN
}